

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O2

int process_single_source
              (string *file_name,string *source_code,string *sqconfig_file_name,bool use_csq,
              bool collect_ident_tree)

{
  char cVar1;
  undefined1 uVar2;
  char *__s2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  Node *node;
  char *initial_file_name;
  uint uVar9;
  int __val;
  ulong uVar10;
  Lexer *this;
  undefined7 in_register_00000081;
  byte bVar11;
  char *__s1;
  allocator local_495;
  uint local_494;
  undefined4 local_490;
  undefined4 local_48c;
  char *local_488;
  char *local_480;
  string sqconfigFileName;
  undefined1 local_440 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  Lexer lex;
  string local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  CompilationContext ctx;
  ifstream tmp;
  undefined4 uStack_234;
  uint auStack_218 [50];
  undefined8 auStack_150 [36];
  
  uVar10 = CONCAT71(in_register_00000081,collect_ident_tree) & 0xffffffff;
  CompilationContext::CompilationContext(&ctx);
  local_490 = (undefined4)CONCAT71(in_register_00000081,collect_ident_tree);
  local_48c = (undefined4)CONCAT71((int7)(uVar10 >> 8),~(byte)uVar10 & use_csq);
  bVar6 = false;
  bVar4 = false;
  local_480 = "";
  local_488 = "";
  local_494 = 0;
  for (iVar8 = 1; _tmp = iVar8, iVar8 < argc__; iVar8 = iVar8 + 1) {
    __s2 = argv__[iVar8];
    iVar7 = strcmp("-duplucate-if-expression",__s2);
    __s1 = "-duplicate-if-expression";
    if (iVar7 != 0) {
      __s1 = __s2;
    }
    iVar7 = strncmp(__s1,"--tokens-output-file:",0x15);
    if (iVar7 == 0) {
      local_480 = __s1 + 0x15;
      bVar6 = true;
LAB_00114c04:
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &used_args,(int *)&tmp);
      iVar8 = _tmp;
    }
    else {
      iVar7 = strncmp(__s1,"--ast-output-file:",0x12);
      if (iVar7 == 0) {
        local_488 = __s1 + 0x12;
        bVar4 = true;
        goto LAB_00114c04;
      }
      iVar7 = strcmp(__s1,"--inverse-warnings");
      if (iVar7 == 0) {
        local_494 = 1;
        goto LAB_00114c04;
      }
      iVar7 = strncmp(__s1,"--csq-exe:",10);
      if (iVar7 == 0) {
        std::__cxx11::string::assign(moduleexports::csq_exe_abi_cxx11_);
        goto LAB_00114c04;
      }
      iVar7 = strncmp(__s1,"--output-mode:",0xe);
      if (iVar7 == 0) {
        ctx.outputMode = str_to_output_mode(__s1 + 0xe);
        goto LAB_00114c04;
      }
      if (*__s1 == '-') {
        cVar1 = __s1[1];
        iVar7 = toupper((int)cVar1);
        if ((iVar7 == 0x57) && ((int)__s1[2] - 0x30U < 10)) {
          iVar8 = atoi(__s1 + 2);
          CompilationContext::suppressWaring(&ctx,iVar8);
        }
        else {
          iVar7 = isalpha((int)cVar1);
          if (iVar7 == 0) goto LAB_00114c20;
          CompilationContext::suppressWaring(&ctx,__s1 + 1);
        }
        goto LAB_00114c04;
      }
    }
LAB_00114c20:
  }
  uVar2 = (undefined1)local_48c;
  if ((local_494 & 1) != 0) {
    CompilationContext::inverseWarningsSuppression(&ctx);
  }
  bVar5 = CompilationContext::isWarningSuppressed(&ctx,"undefined-variable");
  if ((bVar5) && (bVar5 = CompilationContext::isWarningSuppressed(&ctx,"never-declared"), bVar5)) {
    uVar2 = 0;
  }
  variable_presense_check = (bool)uVar2;
  if (file_name->_M_string_length == 0) {
    CompilationContext::globalError("Expected file name");
LAB_00114f5d:
    uVar9 = 1;
    goto LAB_00115206;
  }
  if (source_code->_M_string_length == 0) {
    std::ifstream::ifstream(&tmp,(string *)file_name,_S_in);
    lVar3 = *(long *)(CONCAT44(uStack_234,_tmp) + -0x18);
    uVar9 = *(uint *)((long)auStack_218 + lVar3);
    if ((uVar9 & 5) == 0) {
      lex.s = (string *)&lex.tokenIdentStringToType._M_t._M_impl.super__Rb_tree_header;
      std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
                ((string *)&lex,*(undefined8 *)((long)auStack_150 + lVar3));
      this = &lex;
      std::__cxx11::string::operator=((string *)&ctx.code,(string *)this);
    }
    else {
      std::__cxx11::string::string
                ((string *)local_440,"Cannot open file \'",(allocator *)(local_440 + 0x20));
      std::operator+(&sqconfigFileName,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_440,
                     (file_name->_M_dataplus)._M_p);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lex,
                     &sqconfigFileName,"\'");
      CompilationContext::globalError((char *)lex.s);
      std::__cxx11::string::~string((string *)&lex);
      std::__cxx11::string::~string((string *)&sqconfigFileName);
      this = (Lexer *)local_440;
    }
    std::__cxx11::string::~string((string *)this);
    std::ifstream::~ifstream(&tmp);
    if ((uVar9 & 5) != 0) goto LAB_00114f5d;
  }
  else {
    std::__cxx11::string::_M_assign((string *)&ctx.code);
  }
  CompilationContext::setFileName(&ctx,file_name);
  if (sqconfig_file_name->_M_string_length == 0) {
    settings::search_sqconfig_abi_cxx11_
              (&sqconfigFileName,(settings *)(file_name->_M_dataplus)._M_p,initial_file_name);
  }
  else {
    std::__cxx11::string::string((string *)&sqconfigFileName,(string *)sqconfig_file_name);
  }
  bVar5 = std::operator!=(&sqconfigFileName,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          settings::cur_config_file_name_abi_cxx11_);
  if (bVar5) {
    settings::reset();
    if ((sqconfigFileName._M_string_length != 0) &&
       (bVar5 = settings::append_from_file(sqconfigFileName._M_dataplus._M_p), !bVar5))
    goto LAB_00114ef5;
LAB_00114de1:
    if (variable_presense_check == true) {
      moduleexports::module_export_collector(&ctx,0,0,(char *)0x0);
    }
    iVar8 = strncmp(ctx.code._M_dataplus._M_p,"//expect:error",0xe);
    iVar7 = strncmp(ctx.code._M_dataplus._M_p,"//expect:w",10);
    __val = 0;
    if (iVar7 == 0) {
      __val = atoi(ctx.code._M_dataplus._M_p + 10);
    }
    if (__val != 0 || iVar8 == 0) {
      CompilationContext::clearSuppressedWarnings(&ctx);
    }
    if (((bVar6) || (bVar4)) && (CompilationContext::redirectMessagesToJson == (char *)0x0)) {
      CompilationContext::clearSuppressedWarnings(&ctx);
      CompilationContext::inverseWarningsSuppression(&ctx);
    }
    bVar5 = process_import(&ctx);
    if (!bVar5) goto LAB_00114ef5;
    Lexer::Lexer(&lex,&ctx);
    bVar5 = Lexer::process(&lex);
    if (bVar6) {
      bVar6 = tokens_to_json(local_480,&lex);
      if (bVar5 && bVar6) goto LAB_00114f6a;
LAB_00114eed:
      bVar6 = false;
LAB_0011506e:
      if (ctx.isError == false) {
        if (iVar8 != 0) {
          bVar11 = bVar6 & (ctx.isWarning ^ 1U);
          goto LAB_00115091;
        }
        CompilationContext::globalError("Expected error.");
      }
      else {
        bVar11 = 0;
LAB_00115091:
        if ((__val == 0) ||
           (((ctx.isWarning == true &&
             ((long)ctx.shownWarningsAndErrors.super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)ctx.shownWarningsAndErrors.super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_start == 4)) &&
            (*ctx.shownWarningsAndErrors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start == __val)))) {
          if (__val == 0 && iVar8 != 0) {
            uVar9 = (uint)(bVar11 ^ 1);
          }
          else {
            iVar8 = CompilationContext::getErrorLevel();
            uVar9 = 0;
            if (iVar8 != 4) {
              CompilationContext::clearErrorLevel();
            }
          }
          goto LAB_001151ef;
        }
        std::__cxx11::string::string
                  ((string *)&local_378,"Expected only one warning \'w",&local_495);
        std::__cxx11::to_string(&local_398,__val);
        std::operator+(&local_358,&local_378,&local_398);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_440 + 0x20),&local_358,"\' in file \'");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_440,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_440 + 0x20),&ctx.fileName);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmp,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_440,"\'");
        CompilationContext::globalError((char *)CONCAT44(uStack_234,_tmp));
        std::__cxx11::string::~string((string *)&tmp);
        std::__cxx11::string::~string((string *)local_440);
        std::__cxx11::string::~string((string *)(local_440 + 0x20));
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)&local_378);
      }
      uVar9 = 1;
    }
    else {
      if (!bVar5) goto LAB_00114eed;
LAB_00114f6a:
      node = sq3_parse(&lex);
      if (bVar4) {
        bVar6 = ast_to_json(local_488,node);
        bVar6 = bVar6 && ctx.isError == false;
      }
      else {
        bVar6 = true;
      }
      if ((ctx.isError & 1U) != 0) goto LAB_0011506e;
      if ((char)local_490 == '\0') {
        Analyzer::Analyzer((Analyzer *)&tmp,&lex);
        if (node != (Node *)0x0) {
          collect_ever_declared(&lex);
          Analyzer::collectGlobalTables((Analyzer *)&tmp,node);
          Analyzer::check((Analyzer *)&tmp,node);
          Analyzer::checkVariables
                    ((Analyzer *)&tmp,node,0,0x3fffffff,false,false,false,false,1,false);
        }
        Analyzer::~Analyzer((Analyzer *)&tmp);
        goto LAB_0011506e;
      }
      if (node == (Node *)0x0) goto LAB_0011506e;
      collect_ever_declared(&lex);
      uVar9 = 0;
      global_collect_tree(node,&ident_root);
    }
LAB_001151ef:
    Lexer::~Lexer(&lex);
  }
  else {
    if (settings::cur_config_file_failed == '\0') goto LAB_00114de1;
LAB_00114ef5:
    uVar9 = 1;
  }
  std::__cxx11::string::~string((string *)&sqconfigFileName);
LAB_00115206:
  CompilationContext::~CompilationContext(&ctx);
  return uVar9;
}

Assistant:

int process_single_source(const string & file_name, const string & source_code, const string & sqconfig_file_name,
  bool use_csq, bool collect_ident_tree)
{
  CompilationContext ctx;

  if (collect_ident_tree)
    use_csq = false;

  bool inverseWarnings = false;
  bool printAst = false;

  bool printTokensToJson = false;
  bool printAstToJson = false;
  const char * tokensFileName = "";
  const char * astFileName = "";

  for (int i = 1; i < argc__; i++)
  {
    const char * arg = argv__[i];
    bool used = true;

    {
      // HACK: fix "duplucate-if-expression" -> "duplicate-if-expression", and support old config files
      if (!strcmp("-duplucate-if-expression", arg))
        arg = "-duplicate-if-expression";
    }

    if (!strncmp(arg, "--tokens-output-file:", 21))
    {
      printTokensToJson = true;
      tokensFileName = arg + 21;
    }
    else if (!strncmp(arg, "--ast-output-file:", 18))
    {
      printAstToJson = true;
      astFileName = arg + 18;
    }
    else if (!strcmp(arg, "--inverse-warnings"))
      inverseWarnings = true;
    else if (!strncmp(arg, "--csq-exe:", 10))
      moduleexports::csq_exe = arg + 10;
//    else if (!strcmp(arg, "--print-ast"))  // deprecated
//      printAst = true;
    else if (!strncmp(arg, "--output-mode:", 14))
      ctx.outputMode = str_to_output_mode(arg + 14);
    else if (arg[0] == '-' && (toupper(arg[1]) == 'W') && isdigit(arg[2]))
      ctx.suppressWaring(atoi(arg + 2));
    else if (arg[0] == '-' && isalpha(arg[1]))
      ctx.suppressWaring(arg + 1);
    else
      used = false;

    if (used)
      used_args.insert(i);
  }

  if (inverseWarnings)
    ctx.inverseWarningsSuppression();

  variable_presense_check = (!ctx.isWarningSuppressed("undefined-variable") ||
    !ctx.isWarningSuppressed("never-declared")) && use_csq;

  int expectWarningNumber = 0;
  bool expectError = false;


  if (file_name.empty())
  {
    CompilationContext::globalError("Expected file name");
    return 1;
  }

  if (source_code.empty())
  {
    ifstream tmp(file_name);
    if (tmp.fail())
    {
      CompilationContext::globalError((string("Cannot open file '") + file_name.c_str() + "'").c_str());
      return 1;
    }
    ctx.code = string((std::istreambuf_iterator<char>(tmp)), std::istreambuf_iterator<char>());
  }
  else
  {
    ctx.code = source_code;
  }

  ctx.setFileName(file_name);


  string sqconfigFileName = sqconfig_file_name.empty() ? settings::search_sqconfig(file_name.c_str()) : sqconfig_file_name;
  if (sqconfigFileName != settings::cur_config_file_name)
  {
    settings::reset();
    if (!sqconfigFileName.empty())
      if (!settings::append_from_file(sqconfigFileName.c_str()))
        return 1;
  }
  else if (settings::cur_config_file_failed)
  {
    return 1;
  }


  if (variable_presense_check)
    moduleexports::module_export_collector(ctx, 0, 0, nullptr);


  if (!strncmp(ctx.code.c_str(), "//expect:error", sizeof("//expect:error") - 1))
    expectError = true;

  if (!strncmp(ctx.code.c_str(), "//expect:w", sizeof("//expect:w") - 1))
    expectWarningNumber = atoi(ctx.code.c_str() + sizeof("//expect:w") - 1);

  if (expectError || expectWarningNumber)
    ctx.clearSuppressedWarnings();

  if ((printTokensToJson || printAstToJson) && !CompilationContext::redirectMessagesToJson)
  {
    ctx.clearSuppressedWarnings();
    ctx.inverseWarningsSuppression();
  }

  if (!process_import(ctx))
    return 1;

  Lexer lex(ctx);

  bool res = true;
  res = res && lex.process();

  if (printTokensToJson)
    res &= tokens_to_json(tokensFileName, lex);


  if (res)
  {
    Node * root = sq3_parse(lex); // do not delete, will be destroyed in ~CompilationContext()

    if (printAstToJson)
    {
      res &= ast_to_json(astFileName, root);
      res &= !ctx.isError;
    }

    if (root && printAst)
      root->print();


    if (!ctx.isError)
    {
      if (collect_ident_tree)
      {
        if (root)
        {
          collect_ever_declared(lex);
          global_collect_tree(root, &ident_root);
          return 0;
        }
      }
      else
      {
        Analyzer analyzer(lex);

        if (root)
        {
          collect_ever_declared(lex);
          analyzer.collectGlobalTables(root);
          analyzer.check(root);
          analyzer.checkVariables(root, 0, INT_MAX / 2, false, false, false, false, 1, false);
        }
      }
    }
  }

  if (ctx.isError || ctx.isWarning)
    res = false;

  if (expectError && !ctx.isError)
  {
    CompilationContext::globalError("Expected error.");
    return 1;
  }

  if (expectWarningNumber && (!ctx.isWarning || ctx.shownWarningsAndErrors.size() != 1 ||
    ctx.shownWarningsAndErrors[0] != expectWarningNumber))
  {
    CompilationContext::globalError((string("Expected only one warning 'w") +
      to_string(expectWarningNumber) + "' in file '" + ctx.fileName + "'").c_str());
    return 1;
  }

  if (expectError || expectWarningNumber)
  {
    if (CompilationContext::getErrorLevel() != ERRORLEVEL_FATAL)
      CompilationContext::clearErrorLevel();

    return 0;
  }

  return res ? 0 : 1;
}